

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTest<WordSplitNTest,_testing::internal::TemplateSel<WordSplitNTest_random_Test>,_testing::internal::Types<char16_t,_char32_t>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  pointer pbVar1;
  size_type *psVar2;
  pointer pcVar3;
  CodeLocation CVar4;
  _Alloc_hider _Var5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  SetUpTearDownSuiteFuncType p_Var8;
  SetUpTearDownSuiteFuncType p_Var9;
  undefined8 *puVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_t __n;
  char *pcVar13;
  type_info *ptVar14;
  type_info *ptVar15;
  long lVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 in_stack_fffffffffffffe78;
  type_info *in_stack_fffffffffffffe80;
  type_info *ptVar19;
  long in_stack_fffffffffffffe88;
  TestFactoryBase *pTVar20;
  type_info local_170;
  undefined7 uStack_16f;
  undefined8 uStack_168;
  int local_15c;
  char *local_158;
  type_info *local_150;
  long local_148;
  long local_140;
  undefined8 uStack_138;
  size_type *local_130;
  size_type local_128;
  size_type local_120;
  undefined8 uStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  size_type *local_b0;
  char *local_a8;
  char *local_a0;
  long *local_98 [2];
  long local_88 [2];
  int local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_158 = case_name;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,prefix,(allocator<char> *)&stack0xfffffffffffffe7e);
  pcVar13 = "/";
  if (*prefix == '\0') {
    pcVar13 = "";
  }
  local_a0 = prefix;
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50,pcVar13);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if (paVar12 == paVar11) {
    local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_110._M_dataplus._M_p = (pointer)paVar12;
  }
  local_110._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_110,local_158);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if (paVar12 == paVar11) {
    local_f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_f0._M_dataplus._M_p = (pointer)paVar12;
  }
  local_f0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f0,"/");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if (paVar12 == paVar11) {
    local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_d0._M_dataplus._M_p = (pointer)paVar12;
  }
  local_d0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar1 = (type_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d0,pbVar1[index]._M_dataplus._M_p,pbVar1[index]._M_string_length);
  local_130 = &local_120;
  psVar2 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar12 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2 == paVar12) {
    local_120 = paVar12->_M_allocated_capacity;
    uStack_118 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_120 = paVar12->_M_allocated_capacity;
    local_130 = psVar2;
  }
  psVar2 = local_130;
  local_128 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pcVar13 = strchr(test_names,0x2c);
  local_a8 = test_names;
  if (pcVar13 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffe80,test_names,
               (allocator<char> *)&stack0xfffffffffffffe7f);
  }
  else {
    in_stack_fffffffffffffe80 = &local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe80,test_names,pcVar13);
  }
  local_b0 = psVar2;
  local_150 = in_stack_fffffffffffffe80;
  local_148 = in_stack_fffffffffffffe88;
  if (in_stack_fffffffffffffe88 != 0) {
    ptVar14 = in_stack_fffffffffffffe80 + in_stack_fffffffffffffe88;
    do {
      ptVar19 = in_stack_fffffffffffffe80;
      iVar6 = isspace((uint)(byte)ptVar14[-1]);
      local_150 = in_stack_fffffffffffffe80;
      local_148 = in_stack_fffffffffffffe88;
      if (iVar6 == 0) break;
      ptVar15 = ptVar14 + -1;
      lVar16 = (long)ptVar15 - (long)in_stack_fffffffffffffe80;
      local_150 = ptVar19;
      if ((in_stack_fffffffffffffe88 != lVar16 + 1) &&
         (__n = in_stack_fffffffffffffe88 - (lVar16 + 1), __n != 0)) {
        ptVar14 = ptVar19 + lVar16;
        if (__n == 1) {
          *ptVar14 = ptVar14[1];
        }
        else {
          memmove(ptVar14,ptVar19 + lVar16 + 1,__n);
          local_150 = ptVar19;
        }
      }
      local_148 = in_stack_fffffffffffffe88 + -1;
      local_150[in_stack_fffffffffffffe88 + -1] = (type_info)0x0;
      ptVar14 = local_150 + lVar16;
      bVar17 = ptVar15 != in_stack_fffffffffffffe80;
      in_stack_fffffffffffffe80 = local_150;
      in_stack_fffffffffffffe88 = local_148;
    } while (bVar17);
  }
  ptVar14 = &local_170;
  if (local_150 == ptVar14) {
    uStack_138 = uStack_168;
    local_150 = (type_info *)&local_140;
  }
  ptVar19 = local_150;
  local_140 = CONCAT71(uStack_16f,local_170);
  pTVar20 = (TestFactoryBase *)0x0;
  local_170 = (type_info)0x0;
  local_15c = index;
  GetTypeName_abi_cxx11_(&local_70,(internal *)&char16_t::typeinfo,(type_info *)&local_140);
  _Var5._M_p = local_70._M_dataplus._M_p;
  local_98[0] = local_88;
  pcVar3 = (code_location->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar3,pcVar3 + (code_location->file)._M_string_length);
  local_78 = code_location->line;
  p_Var8 = SuiteApiResolver<WordSplitNTest_random_Test<char16_t>_>::GetSetUpCaseOrSuite
                     ((code_location->file)._M_dataplus._M_p,local_78);
  p_Var9 = SuiteApiResolver<WordSplitNTest_random_Test<char16_t>_>::GetTearDownCaseOrSuite
                     ((code_location->file)._M_dataplus._M_p,code_location->line);
  uVar18 = 0x40fe6e;
  puVar10 = (undefined8 *)operator_new(8);
  *puVar10 = &PTR__TestFactoryBase_00574ad0;
  CVar4.file._M_string_length = (size_type)p_Var9;
  CVar4.file._M_dataplus._M_p = (pointer)p_Var8;
  CVar4.file.field_2._M_allocated_capacity = (size_type)puVar10;
  CVar4.file.field_2._8_8_ = uVar18;
  CVar4._32_8_ = in_stack_fffffffffffffe78;
  testing::internal::MakeAndRegisterTestInfo
            ((char *)local_b0,(char *)ptVar19,_Var5._M_p,(char *)0x0,CVar4,local_98,
             (_func_void *)&TypeIdHelper<WordSplitNTest<char16_t>>::dummy_,(_func_void *)ptVar14,
             pTVar20);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  iVar6 = local_15c;
  if (local_150 != (type_info *)&local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (ptVar14 != &local_170) {
    operator_delete(ptVar14,CONCAT71(uStack_16f,local_170) + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pcVar13 = local_a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar17 = TypeParameterizedTest<WordSplitNTest,_testing::internal::TemplateSel<WordSplitNTest_random_Test>,_testing::internal::Types<char32_t>_>
           ::Register(local_a0,code_location,local_158,pcVar13,iVar6 + 1,type_names);
  return bVar17;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }